

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subdivision.cpp
# Opt level: O3

void __thiscall
CatmullClarkSubdivider::Subdivide
          (CatmullClarkSubdivider *this,aiMesh **smesh,size_t nmesh,aiMesh **out,uint num,
          bool discard_input)

{
  aiMesh *this_00;
  Logger *pLVar1;
  uint uVar2;
  size_t sVar3;
  ulong uVar4;
  size_t s;
  aiMesh **_dest;
  aiMesh *i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> maptbl;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> outmeshes;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> inmeshes;
  aiMesh *local_a0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_98;
  uint local_7c;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> local_78;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> local_58;
  aiMesh *local_40;
  CatmullClarkSubdivider *local_38;
  
  if (smesh == (aiMesh **)0x0) {
    __assert_fail("__null != smesh",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/Subdivision.cpp"
                  ,0x91,
                  "virtual void CatmullClarkSubdivider::Subdivide(aiMesh **, size_t, aiMesh **, unsigned int, bool)"
                 );
  }
  if (out == (aiMesh **)0x0) {
    __assert_fail("__null != out",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/Subdivision.cpp"
                  ,0x92,
                  "virtual void CatmullClarkSubdivider::Subdivide(aiMesh **, size_t, aiMesh **, unsigned int, bool)"
                 );
  }
  if (smesh == out) {
    __assert_fail("smesh<out || smesh+nmesh>out+nmesh",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/Subdivision.cpp"
                  ,0x95,
                  "virtual void CatmullClarkSubdivider::Subdivide(aiMesh **, size_t, aiMesh **, unsigned int, bool)"
                 );
  }
  if (num == 0) {
    if (discard_input) {
      if (nmesh != 0) {
        sVar3 = 0;
        do {
          out[sVar3] = smesh[sVar3];
          smesh[sVar3] = (aiMesh *)0x0;
          sVar3 = sVar3 + 1;
        } while (nmesh != sVar3);
      }
    }
    else if (nmesh != 0) {
      sVar3 = 0;
      do {
        Assimp::SceneCombiner::Copy(out,smesh[sVar3]);
        sVar3 = sVar3 + 1;
        out = out + 1;
      } while (nmesh != sVar3);
    }
  }
  else {
    local_58.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data
    ._M_start = (aiMesh **)0x0;
    local_58.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data
    ._M_finish = (aiMesh **)0x0;
    local_58.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage = (aiMesh **)0x0;
    local_78.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage = (pointer)0x0;
    local_78.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data
    ._M_start = (aiMesh **)0x0;
    local_78.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)0x0;
    local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_7c = num;
    local_38 = this;
    std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::reserve(&local_58,nmesh);
    std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::reserve(&local_78,nmesh);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&local_98,nmesh);
    if (nmesh != 0) {
      sVar3 = 0;
      _dest = out;
      do {
        local_a0 = smesh[sVar3];
        if (local_a0->mPrimitiveTypes - 1 < 3) {
          pLVar1 = Assimp::DefaultLogger::get();
          Assimp::Logger::debug(pLVar1,"Catmull-Clark Subdivider: Skipping pure line/point mesh");
          if (discard_input) {
            *_dest = local_a0;
            smesh[sVar3] = (aiMesh *)0x0;
          }
          else {
            Assimp::SceneCombiner::Copy(_dest,local_a0);
          }
        }
        else {
          local_40 = (aiMesh *)0x0;
          std::vector<aiMesh*,std::allocator<aiMesh*>>::emplace_back<aiMesh*>
                    ((vector<aiMesh*,std::allocator<aiMesh*>> *)&local_78,&local_40);
          if (local_58.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_58.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                      ((vector<aiMesh*,std::allocator<aiMesh*>> *)&local_58,
                       (iterator)
                       local_58.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_a0);
          }
          else {
            *local_58.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
             super__Vector_impl_data._M_finish = local_a0;
            local_58.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_58.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          local_40 = (aiMesh *)CONCAT44(local_40._4_4_,(int)sVar3);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    (&local_98,(uint *)&local_40);
        }
        sVar3 = sVar3 + 1;
        _dest = _dest + 1;
      } while (nmesh != sVar3);
    }
    if (((long)local_58.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_58.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
               super__Vector_impl_data._M_start !=
         (long)local_78.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_78.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
               super__Vector_impl_data._M_start) ||
       (sVar3 = (long)local_58.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_58.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3,
       sVar3 != (long)local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 2)) {
      __assert_fail("inmeshes.size()==outmeshes.size()&&inmeshes.size()==maptbl.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/Subdivision.cpp"
                    ,200,
                    "virtual void CatmullClarkSubdivider::Subdivide(aiMesh **, size_t, aiMesh **, unsigned int, bool)"
                   );
    }
    if (local_58.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_58.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pLVar1 = Assimp::DefaultLogger::get();
      Assimp::Logger::warn
                (pLVar1,"Catmull-Clark Subdivider: Pure point/line scene, I can\'t do anything");
    }
    else {
      InternSubdivide(local_38,local_58.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                               _M_impl.super__Vector_impl_data._M_start,sVar3,
                      local_78.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                      super__Vector_impl_data._M_start,local_7c);
      if ((long)local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != 0) {
        uVar2 = 1;
        uVar4 = 0;
        do {
          if (local_78.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
              super__Vector_impl_data._M_start[uVar4] == (aiMesh *)0x0) {
            __assert_fail("nullptr != outmeshes[i]",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/Subdivision.cpp"
                          ,0xcf,
                          "virtual void CatmullClarkSubdivider::Subdivide(aiMesh **, size_t, aiMesh **, unsigned int, bool)"
                         );
          }
          out[local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar4]] =
               local_78.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar4];
          uVar4 = (ulong)uVar2;
          uVar2 = uVar2 + 1;
        } while (uVar4 < (ulong)((long)local_98.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_98.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 2));
      }
      if (discard_input && nmesh != 0) {
        sVar3 = 0;
        do {
          this_00 = smesh[sVar3];
          if (this_00 != (aiMesh *)0x0) {
            aiMesh::~aiMesh(this_00);
          }
          operator_delete(this_00,0x520);
          sVar3 = sVar3 + 1;
        } while (nmesh != sVar3);
      }
    }
    if (local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_78.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
        super__Vector_impl_data._M_start != (aiMesh **)0x0) {
      operator_delete(local_78.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_78.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl
                            .super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl
                            .super__Vector_impl_data._M_start);
    }
    if (local_58.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
        super__Vector_impl_data._M_start != (aiMesh **)0x0) {
      operator_delete(local_58.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_58.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl
                            .super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl
                            .super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void CatmullClarkSubdivider::Subdivide (
    aiMesh** smesh,
    size_t nmesh,
    aiMesh** out,
    unsigned int num,
    bool discard_input
    )
{
    ai_assert( NULL != smesh );
    ai_assert( NULL != out );

    // course, both regions may not overlap
    ai_assert(smesh<out || smesh+nmesh>out+nmesh);
    if (!num) {
        // No subdivision at all. Need to copy all the meshes .. argh.
        if (discard_input) {
            for (size_t s = 0; s < nmesh; ++s) {
                out[s] = smesh[s];
                smesh[s] = NULL;
            }
        }
        else {
            for (size_t s = 0; s < nmesh; ++s) {
                SceneCombiner::Copy(out+s,smesh[s]);
            }
        }
        return;
    }

    std::vector<aiMesh*> inmeshes;
    std::vector<aiMesh*> outmeshes;
    std::vector<unsigned int> maptbl;

    inmeshes.reserve(nmesh);
    outmeshes.reserve(nmesh);
    maptbl.reserve(nmesh);

    // Remove pure line and point meshes from the working set to reduce the
    // number of edge cases the subdivider is forced to deal with. Line and
    // point meshes are simply passed through.
    for (size_t s = 0; s < nmesh; ++s) {
        aiMesh* i = smesh[s];
        // FIX - mPrimitiveTypes might not yet be initialized
        if (i->mPrimitiveTypes && (i->mPrimitiveTypes & (aiPrimitiveType_LINE|aiPrimitiveType_POINT))==i->mPrimitiveTypes) {
            ASSIMP_LOG_DEBUG("Catmull-Clark Subdivider: Skipping pure line/point mesh");

            if (discard_input) {
                out[s] = i;
                smesh[s] = NULL;
            }
            else {
                SceneCombiner::Copy(out+s,i);
            }
            continue;
        }

        outmeshes.push_back(NULL);inmeshes.push_back(i);
        maptbl.push_back(static_cast<unsigned int>(s));
    }

    // Do the actual subdivision on the preallocated storage. InternSubdivide
    // *always* assumes that enough storage is available, it does not bother
    // checking any ranges.
    ai_assert(inmeshes.size()==outmeshes.size()&&inmeshes.size()==maptbl.size());
    if (inmeshes.empty()) {
        ASSIMP_LOG_WARN("Catmull-Clark Subdivider: Pure point/line scene, I can't do anything");
        return;
    }
    InternSubdivide(&inmeshes.front(),inmeshes.size(),&outmeshes.front(),num);
    for (unsigned int i = 0; i < maptbl.size(); ++i) {
        ai_assert(nullptr != outmeshes[i]);
        out[maptbl[i]] = outmeshes[i];
    }

    if (discard_input) {
        for (size_t s = 0; s < nmesh; ++s) {
            delete smesh[s];
        }
    }
}